

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred_avx2.c
# Opt level: O0

void uavs3d_if_ver_chroma_w128_avx2
               (pel *src,int i_src,pel *dst,int i_dst,int width,int height,s8 *coeff,int max_val)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int iVar12;
  int iVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 (*pauVar34) [32];
  undefined1 (*pauVar35) [32];
  undefined1 (*pauVar36) [32];
  undefined1 (*pauVar37) [32];
  undefined1 (*pauVar38) [32];
  undefined1 (*pauVar39) [32];
  undefined1 (*pauVar40) [32];
  undefined1 (*pauVar41) [32];
  int in_ECX;
  undefined8 *in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R9D;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  ushort *in_stack_00000008;
  __m256i mVal3;
  __m256i mVal2;
  __m256i mVal1;
  __m256i mVal0;
  __m256i T7;
  __m256i T6;
  __m256i T5;
  __m256i T4;
  __m256i T3;
  __m256i T2;
  __m256i T1;
  __m256i T0;
  __m256i S7;
  __m256i S6;
  __m256i S5;
  __m256i S4;
  __m256i S3;
  __m256i S2;
  __m256i S1;
  __m256i S0;
  __m256i coeff1;
  __m256i coeff0;
  int i_src3;
  int i_src2;
  __m256i mAddOffset;
  int shift;
  int offset;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  int local_11a4;
  undefined8 *local_1198;
  undefined1 (*local_1188) [32];
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar2 = vpinsrw_avx(ZEXT216(0x20),0x20,1);
  auVar2 = vpinsrw_avx(auVar2,0x20,2);
  auVar2 = vpinsrw_avx(auVar2,0x20,3);
  auVar2 = vpinsrw_avx(auVar2,0x20,4);
  auVar2 = vpinsrw_avx(auVar2,0x20,5);
  auVar2 = vpinsrw_avx(auVar2,0x20,6);
  auVar2 = vpinsrw_avx(auVar2,0x20,7);
  auVar3 = vpinsrw_avx(ZEXT216(0x20),0x20,1);
  auVar3 = vpinsrw_avx(auVar3,0x20,2);
  auVar3 = vpinsrw_avx(auVar3,0x20,3);
  auVar3 = vpinsrw_avx(auVar3,0x20,4);
  auVar3 = vpinsrw_avx(auVar3,0x20,5);
  auVar3 = vpinsrw_avx(auVar3,0x20,6);
  auVar3 = vpinsrw_avx(auVar3,0x20,7);
  uStack_f0 = auVar3._0_8_;
  uStack_e8 = auVar3._8_8_;
  iVar13 = in_ESI * 2;
  iVar12 = in_ESI * 3;
  uVar1 = *in_stack_00000008;
  auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
  auVar43 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
  auVar43 = vpinsrw_avx(auVar43,(uint)uVar1,2);
  auVar43 = vpinsrw_avx(auVar43,(uint)uVar1,3);
  auVar43 = vpinsrw_avx(auVar43,(uint)uVar1,4);
  auVar43 = vpinsrw_avx(auVar43,(uint)uVar1,5);
  auVar43 = vpinsrw_avx(auVar43,(uint)uVar1,6);
  auVar43 = vpinsrw_avx(auVar43,(uint)uVar1,7);
  uStack_b0 = auVar43._0_8_;
  uStack_a8 = auVar43._8_8_;
  uVar1 = in_stack_00000008[1];
  auVar43 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
  auVar43 = vpinsrw_avx(auVar43,(uint)uVar1,2);
  auVar43 = vpinsrw_avx(auVar43,(uint)uVar1,3);
  auVar43 = vpinsrw_avx(auVar43,(uint)uVar1,4);
  auVar43 = vpinsrw_avx(auVar43,(uint)uVar1,5);
  auVar43 = vpinsrw_avx(auVar43,(uint)uVar1,6);
  auVar43 = vpinsrw_avx(auVar43,(uint)uVar1,7);
  auVar42 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
  auVar42 = vpinsrw_avx(auVar42,(uint)uVar1,2);
  auVar42 = vpinsrw_avx(auVar42,(uint)uVar1,3);
  auVar42 = vpinsrw_avx(auVar42,(uint)uVar1,4);
  auVar42 = vpinsrw_avx(auVar42,(uint)uVar1,5);
  auVar42 = vpinsrw_avx(auVar42,(uint)uVar1,6);
  auVar42 = vpinsrw_avx(auVar42,(uint)uVar1,7);
  auVar42 = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar42;
  auVar43 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar43;
  uStack_70 = auVar43._0_8_;
  uStack_68 = auVar43._8_8_;
  local_1188 = (undefined1 (*) [32])(in_RDI - in_ESI);
  local_11a4 = in_R9D;
  local_1198 = in_RDX;
  while (local_11a4 != 0) {
    auVar8 = vpunpcklbw_avx2(*local_1188,*(undefined1 (*) [32])(*local_1188 + in_ESI));
    auVar9 = vpunpcklbw_avx2(*(undefined1 (*) [32])(*local_1188 + iVar13),
                             *(undefined1 (*) [32])(*local_1188 + iVar12));
    auVar4 = vpunpckhbw_avx2(*local_1188,*(undefined1 (*) [32])(*local_1188 + in_ESI));
    auVar5 = vpunpckhbw_avx2(*(undefined1 (*) [32])(*local_1188 + iVar13),
                             *(undefined1 (*) [32])(*local_1188 + iVar12));
    auVar10 = vpunpcklbw_avx2(local_1188[1],*(undefined1 (*) [32])(local_1188[1] + in_ESI));
    auVar11 = vpunpcklbw_avx2(*(undefined1 (*) [32])(local_1188[1] + iVar13),
                              *(undefined1 (*) [32])(local_1188[1] + iVar12));
    auVar6 = vpunpckhbw_avx2(local_1188[1],*(undefined1 (*) [32])(local_1188[1] + in_ESI));
    auVar7 = vpunpckhbw_avx2(*(undefined1 (*) [32])(local_1188[1] + iVar13),
                             *(undefined1 (*) [32])(local_1188[1] + iVar12));
    auVar29._16_8_ = uStack_b0;
    auVar29._0_16_ = auVar3;
    auVar29._24_8_ = uStack_a8;
    auVar8 = vpmaddubsw_avx2(auVar8,auVar29);
    auVar28._16_8_ = uStack_70;
    auVar28._0_16_ = auVar42;
    auVar28._24_8_ = uStack_68;
    auVar9 = vpmaddubsw_avx2(auVar9,auVar28);
    auVar27._16_8_ = uStack_b0;
    auVar27._0_16_ = auVar3;
    auVar27._24_8_ = uStack_a8;
    auVar4 = vpmaddubsw_avx2(auVar4,auVar27);
    auVar26._16_8_ = uStack_70;
    auVar26._0_16_ = auVar42;
    auVar26._24_8_ = uStack_68;
    auVar5 = vpmaddubsw_avx2(auVar5,auVar26);
    auVar25._16_8_ = uStack_b0;
    auVar25._0_16_ = auVar3;
    auVar25._24_8_ = uStack_a8;
    auVar10 = vpmaddubsw_avx2(auVar10,auVar25);
    auVar24._16_8_ = uStack_70;
    auVar24._0_16_ = auVar42;
    auVar24._24_8_ = uStack_68;
    auVar11 = vpmaddubsw_avx2(auVar11,auVar24);
    auVar23._16_8_ = uStack_b0;
    auVar23._0_16_ = auVar3;
    auVar23._24_8_ = uStack_a8;
    auVar6 = vpmaddubsw_avx2(auVar6,auVar23);
    auVar22._16_8_ = uStack_70;
    auVar22._0_16_ = auVar42;
    auVar22._24_8_ = uStack_68;
    auVar7 = vpmaddubsw_avx2(auVar7,auVar22);
    auVar8 = vpaddw_avx2(auVar8,auVar9);
    auVar9 = vpaddw_avx2(auVar4,auVar5);
    auVar4 = vpaddw_avx2(auVar10,auVar11);
    auVar5 = vpaddw_avx2(auVar6,auVar7);
    auVar33._16_8_ = uStack_f0;
    auVar33._0_16_ = auVar2;
    auVar33._24_8_ = uStack_e8;
    auVar8 = vpaddw_avx2(auVar8,auVar33);
    auVar32._16_8_ = uStack_f0;
    auVar32._0_16_ = auVar2;
    auVar32._24_8_ = uStack_e8;
    auVar9 = vpaddw_avx2(auVar9,auVar32);
    auVar31._16_8_ = uStack_f0;
    auVar31._0_16_ = auVar2;
    auVar31._24_8_ = uStack_e8;
    auVar4 = vpaddw_avx2(auVar4,auVar31);
    auVar30._16_8_ = uStack_f0;
    auVar30._0_16_ = auVar2;
    auVar30._24_8_ = uStack_e8;
    auVar5 = vpaddw_avx2(auVar5,auVar30);
    auVar8 = vpsraw_avx2(auVar8,ZEXT416(6));
    auVar9 = vpsraw_avx2(auVar9,ZEXT416(6));
    auVar4 = vpsraw_avx2(auVar4,ZEXT416(6));
    auVar5 = vpsraw_avx2(auVar5,ZEXT416(6));
    auVar8 = vpackuswb_avx2(auVar8,auVar9);
    auVar9 = vpackuswb_avx2(auVar4,auVar5);
    local_1460 = auVar8._0_8_;
    uStack_1458 = auVar8._8_8_;
    uStack_1450 = auVar8._16_8_;
    uStack_1448 = auVar8._24_8_;
    *local_1198 = local_1460;
    local_1198[1] = uStack_1458;
    local_1198[2] = uStack_1450;
    local_1198[3] = uStack_1448;
    local_1480 = auVar9._0_8_;
    uStack_1478 = auVar9._8_8_;
    uStack_1470 = auVar9._16_8_;
    uStack_1468 = auVar9._24_8_;
    local_1198[4] = local_1480;
    local_1198[5] = uStack_1478;
    local_1198[6] = uStack_1470;
    local_1198[7] = uStack_1468;
    pauVar40 = local_1188 + 2;
    pauVar41 = local_1188 + 3;
    pauVar34 = local_1188 + 2;
    pauVar35 = local_1188 + 3;
    pauVar36 = local_1188 + 2;
    pauVar37 = local_1188 + 3;
    pauVar38 = local_1188 + 2;
    pauVar39 = local_1188 + 3;
    local_1188 = (undefined1 (*) [32])(*local_1188 + in_ESI);
    auVar8 = vpunpcklbw_avx2(*pauVar40,*(undefined1 (*) [32])(*pauVar34 + in_ESI));
    auVar9 = vpunpcklbw_avx2(*(undefined1 (*) [32])(*pauVar36 + iVar13),
                             *(undefined1 (*) [32])(*pauVar38 + iVar12));
    auVar4 = vpunpckhbw_avx2(*pauVar40,*(undefined1 (*) [32])(*pauVar34 + in_ESI));
    auVar5 = vpunpckhbw_avx2(*(undefined1 (*) [32])(*pauVar36 + iVar13),
                             *(undefined1 (*) [32])(*pauVar38 + iVar12));
    auVar10 = vpunpcklbw_avx2(*pauVar41,*(undefined1 (*) [32])(*pauVar35 + in_ESI));
    auVar11 = vpunpcklbw_avx2(*(undefined1 (*) [32])(*pauVar37 + iVar13),
                              *(undefined1 (*) [32])(*pauVar39 + iVar12));
    auVar6 = vpunpckhbw_avx2(*pauVar41,*(undefined1 (*) [32])(*pauVar35 + in_ESI));
    auVar7 = vpunpckhbw_avx2(*(undefined1 (*) [32])(*pauVar37 + iVar13),
                             *(undefined1 (*) [32])(*pauVar39 + iVar12));
    auVar21._16_8_ = uStack_b0;
    auVar21._0_16_ = auVar3;
    auVar21._24_8_ = uStack_a8;
    auVar8 = vpmaddubsw_avx2(auVar8,auVar21);
    auVar20._16_8_ = uStack_70;
    auVar20._0_16_ = auVar42;
    auVar20._24_8_ = uStack_68;
    auVar9 = vpmaddubsw_avx2(auVar9,auVar20);
    auVar19._16_8_ = uStack_b0;
    auVar19._0_16_ = auVar3;
    auVar19._24_8_ = uStack_a8;
    auVar4 = vpmaddubsw_avx2(auVar4,auVar19);
    auVar18._16_8_ = uStack_70;
    auVar18._0_16_ = auVar42;
    auVar18._24_8_ = uStack_68;
    auVar5 = vpmaddubsw_avx2(auVar5,auVar18);
    auVar17._16_8_ = uStack_b0;
    auVar17._0_16_ = auVar3;
    auVar17._24_8_ = uStack_a8;
    auVar10 = vpmaddubsw_avx2(auVar10,auVar17);
    auVar16._16_8_ = uStack_70;
    auVar16._0_16_ = auVar42;
    auVar16._24_8_ = uStack_68;
    auVar11 = vpmaddubsw_avx2(auVar11,auVar16);
    auVar15._16_8_ = uStack_b0;
    auVar15._0_16_ = auVar3;
    auVar15._24_8_ = uStack_a8;
    auVar6 = vpmaddubsw_avx2(auVar6,auVar15);
    auVar14._16_8_ = uStack_70;
    auVar14._0_16_ = auVar42;
    auVar14._24_8_ = uStack_68;
    auVar7 = vpmaddubsw_avx2(auVar7,auVar14);
    auVar8 = vpaddw_avx2(auVar8,auVar9);
    auVar9 = vpaddw_avx2(auVar4,auVar5);
    auVar4 = vpaddw_avx2(auVar10,auVar11);
    auVar5 = vpaddw_avx2(auVar6,auVar7);
    auVar7._16_8_ = uStack_f0;
    auVar7._0_16_ = auVar2;
    auVar7._24_8_ = uStack_e8;
    auVar8 = vpaddw_avx2(auVar8,auVar7);
    auVar6._16_8_ = uStack_f0;
    auVar6._0_16_ = auVar2;
    auVar6._24_8_ = uStack_e8;
    auVar9 = vpaddw_avx2(auVar9,auVar6);
    auVar11._16_8_ = uStack_f0;
    auVar11._0_16_ = auVar2;
    auVar11._24_8_ = uStack_e8;
    auVar4 = vpaddw_avx2(auVar4,auVar11);
    auVar10._16_8_ = uStack_f0;
    auVar10._0_16_ = auVar2;
    auVar10._24_8_ = uStack_e8;
    auVar5 = vpaddw_avx2(auVar5,auVar10);
    auVar8 = vpsraw_avx2(auVar8,ZEXT416(6));
    auVar9 = vpsraw_avx2(auVar9,ZEXT416(6));
    auVar4 = vpsraw_avx2(auVar4,ZEXT416(6));
    auVar5 = vpsraw_avx2(auVar5,ZEXT416(6));
    auVar8 = vpackuswb_avx2(auVar8,auVar9);
    auVar9 = vpackuswb_avx2(auVar4,auVar5);
    local_1460 = auVar8._0_8_;
    uStack_1458 = auVar8._8_8_;
    uStack_1450 = auVar8._16_8_;
    uStack_1448 = auVar8._24_8_;
    local_1198[8] = local_1460;
    local_1198[9] = uStack_1458;
    local_1198[10] = uStack_1450;
    local_1198[0xb] = uStack_1448;
    local_1480 = auVar9._0_8_;
    uStack_1478 = auVar9._8_8_;
    uStack_1470 = auVar9._16_8_;
    uStack_1468 = auVar9._24_8_;
    local_1198[0xc] = local_1480;
    local_1198[0xd] = uStack_1478;
    local_1198[0xe] = uStack_1470;
    local_1198[0xf] = uStack_1468;
    local_1198 = (undefined8 *)((long)local_1198 + (long)in_ECX);
    local_11a4 = local_11a4 + -1;
  }
  return;
}

Assistant:

void uavs3d_if_ver_chroma_w128_avx2(const pel *src, int i_src, pel *dst, int i_dst, int width, int height, const s8 *coeff, int max_val)
{
    const int offset = 32;
    const int shift = 6;
    __m256i mAddOffset = _mm256_set1_epi16(offset);
    const int i_src2 = i_src * 2;
    const int i_src3 = i_src * 3;
    __m256i coeff0 = _mm256_set1_epi16(*(s16*)coeff);
    __m256i coeff1 = _mm256_set1_epi16(*(s16*)(coeff + 2));
    __m256i S0, S1, S2, S3, S4, S5, S6, S7;
    __m256i T0, T1, T2, T3, T4, T5, T6, T7, mVal0, mVal1, mVal2, mVal3;

    src -= i_src;

    while (height--) {
        S0 = _mm256_loadu_si256((__m256i*)(src));
        S4 = _mm256_loadu_si256((__m256i*)(src + 32));
        S1 = _mm256_loadu_si256((__m256i*)(src + i_src));
        S5 = _mm256_loadu_si256((__m256i*)(src + i_src + 32));
        S2 = _mm256_loadu_si256((__m256i*)(src + i_src2));
        S6 = _mm256_loadu_si256((__m256i*)(src + i_src2 + 32));
        S3 = _mm256_loadu_si256((__m256i*)(src + i_src3));
        S7 = _mm256_loadu_si256((__m256i*)(src + i_src3 + 32));

        T0 = _mm256_unpacklo_epi8(S0, S1);
        T1 = _mm256_unpacklo_epi8(S2, S3);
        T2 = _mm256_unpackhi_epi8(S0, S1);
        T3 = _mm256_unpackhi_epi8(S2, S3);
        T4 = _mm256_unpacklo_epi8(S4, S5);
        T5 = _mm256_unpacklo_epi8(S6, S7);
        T6 = _mm256_unpackhi_epi8(S4, S5);
        T7 = _mm256_unpackhi_epi8(S6, S7);

        T0 = _mm256_maddubs_epi16(T0, coeff0);
        T1 = _mm256_maddubs_epi16(T1, coeff1);
        T2 = _mm256_maddubs_epi16(T2, coeff0);
        T3 = _mm256_maddubs_epi16(T3, coeff1);
        T4 = _mm256_maddubs_epi16(T4, coeff0);
        T5 = _mm256_maddubs_epi16(T5, coeff1);
        T6 = _mm256_maddubs_epi16(T6, coeff0);
        T7 = _mm256_maddubs_epi16(T7, coeff1);

        mVal0 = _mm256_add_epi16(T0, T1);
        mVal1 = _mm256_add_epi16(T2, T3);
        mVal2 = _mm256_add_epi16(T4, T5);
        mVal3 = _mm256_add_epi16(T6, T7);

        mVal0 = _mm256_add_epi16(mVal0, mAddOffset);
        mVal1 = _mm256_add_epi16(mVal1, mAddOffset);
        mVal2 = _mm256_add_epi16(mVal2, mAddOffset);
        mVal3 = _mm256_add_epi16(mVal3, mAddOffset);
        mVal0 = _mm256_srai_epi16(mVal0, shift);
        mVal1 = _mm256_srai_epi16(mVal1, shift);
        mVal2 = _mm256_srai_epi16(mVal2, shift);
        mVal3 = _mm256_srai_epi16(mVal3, shift);
        mVal0 = _mm256_packus_epi16(mVal0, mVal1);
        mVal1 = _mm256_packus_epi16(mVal2, mVal3);

        _mm256_storeu_si256((__m256i*)(dst), mVal0);
        _mm256_storeu_si256((__m256i*)(dst + 32), mVal1);

        S0 = _mm256_loadu_si256((__m256i*)(src + 64));
        S4 = _mm256_loadu_si256((__m256i*)(src + 96));
        S1 = _mm256_loadu_si256((__m256i*)(src + i_src + 64));
        S5 = _mm256_loadu_si256((__m256i*)(src + i_src + 96));
        S2 = _mm256_loadu_si256((__m256i*)(src + i_src2 + 64));
        S6 = _mm256_loadu_si256((__m256i*)(src + i_src2 + 96));
        S3 = _mm256_loadu_si256((__m256i*)(src + i_src3 + 64));
        S7 = _mm256_loadu_si256((__m256i*)(src + i_src3 + 96));

        src += i_src;
        uavs3d_prefetch(src + i_src3, _MM_HINT_NTA);

        T0 = _mm256_unpacklo_epi8(S0, S1);
        T1 = _mm256_unpacklo_epi8(S2, S3);
        T2 = _mm256_unpackhi_epi8(S0, S1);
        T3 = _mm256_unpackhi_epi8(S2, S3);
        T4 = _mm256_unpacklo_epi8(S4, S5);
        T5 = _mm256_unpacklo_epi8(S6, S7);
        T6 = _mm256_unpackhi_epi8(S4, S5);
        T7 = _mm256_unpackhi_epi8(S6, S7);

        T0 = _mm256_maddubs_epi16(T0, coeff0);
        T1 = _mm256_maddubs_epi16(T1, coeff1);
        T2 = _mm256_maddubs_epi16(T2, coeff0);
        T3 = _mm256_maddubs_epi16(T3, coeff1);
        T4 = _mm256_maddubs_epi16(T4, coeff0);
        T5 = _mm256_maddubs_epi16(T5, coeff1);
        T6 = _mm256_maddubs_epi16(T6, coeff0);
        T7 = _mm256_maddubs_epi16(T7, coeff1);

        mVal0 = _mm256_add_epi16(T0, T1);
        mVal1 = _mm256_add_epi16(T2, T3);
        mVal2 = _mm256_add_epi16(T4, T5);
        mVal3 = _mm256_add_epi16(T6, T7);

        mVal0 = _mm256_add_epi16(mVal0, mAddOffset);
        mVal1 = _mm256_add_epi16(mVal1, mAddOffset);
        mVal2 = _mm256_add_epi16(mVal2, mAddOffset);
        mVal3 = _mm256_add_epi16(mVal3, mAddOffset);
        mVal0 = _mm256_srai_epi16(mVal0, shift);
        mVal1 = _mm256_srai_epi16(mVal1, shift);
        mVal2 = _mm256_srai_epi16(mVal2, shift);
        mVal3 = _mm256_srai_epi16(mVal3, shift);
        mVal0 = _mm256_packus_epi16(mVal0, mVal1);
        mVal1 = _mm256_packus_epi16(mVal2, mVal3);

        _mm256_storeu_si256((__m256i*)(dst + 64), mVal0);
        _mm256_storeu_si256((__m256i*)(dst + 96), mVal1);

        dst += i_dst;
    }
}